

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadAiger.c
# Opt level: O0

Vec_Int_t * Io_WriteDecodeLiterals(char **ppPos,int nEntries)

{
  uint uVar1;
  Vec_Int_t *p;
  int local_34;
  int local_30;
  int i;
  int Diff;
  int LitPrev;
  int Lit;
  Vec_Int_t *vLits;
  int nEntries_local;
  char **ppPos_local;
  
  p = Vec_IntAlloc(nEntries);
  i = Io_ReadAigerDecode(ppPos);
  Vec_IntPush(p,i);
  for (local_30 = 1; local_30 < nEntries; local_30 = local_30 + 1) {
    uVar1 = Io_ReadAigerDecode(ppPos);
    local_34 = (int)uVar1 >> 1;
    if ((uVar1 & 1) != 0) {
      local_34 = -local_34;
    }
    i = local_34 + i;
    Vec_IntPush(p,i);
  }
  return p;
}

Assistant:

Vec_Int_t * Io_WriteDecodeLiterals( char ** ppPos, int nEntries )
{
    Vec_Int_t * vLits;
    int Lit, LitPrev, Diff, i;
    vLits = Vec_IntAlloc( nEntries );
    LitPrev = Io_ReadAigerDecode( ppPos );
    Vec_IntPush( vLits, LitPrev );
    for ( i = 1; i < nEntries; i++ )
    {
//        Diff = Lit - LitPrev;
//        Diff = (Lit < LitPrev)? -Diff : Diff;
//        Diff = ((2 * Diff) << 1) | (int)(Lit < LitPrev);
        Diff = Io_ReadAigerDecode( ppPos );
        Diff = (Diff & 1)? -(Diff >> 1) : Diff >> 1;
        Lit  = Diff + LitPrev;
        Vec_IntPush( vLits, Lit );
        LitPrev = Lit;
    }
    return vLits;
}